

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O2

void dsfmt_chk_init_by_array(dsfmt_t *dsfmt,uint32_t *init_key,int key_length,int mexp)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  bool bVar10;
  
  if (mexp != 0x4de1) {
    fwrite("DSFMT_MEXP doesn\'t match with dSFMT.c\n",0x26,1,_stderr);
    exit(1);
  }
  memset(dsfmt,0x8b,0xc00);
  *(undefined4 *)((long)dsfmt->status + 0x5e8) = 0xdd4afe5d;
  *(int *)((long)dsfmt->status + 0x614) = key_length + -0x22b501a3;
  dsfmt->status[0].u32[0] = key_length + 0x51bf72d2;
  uVar6 = 0;
  uVar2 = 0;
  if (0 < key_length) {
    uVar2 = (ulong)(uint)key_length;
  }
  uVar5 = 1;
  for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
    iVar4 = (int)uVar5;
    iVar3 = (iVar4 + 0x17a) % 0x300;
    uVar7 = dsfmt->status[0].u32[iVar4] ^ dsfmt->status[0].u32[(iVar4 + 0x2ff) % 0x300] ^
            dsfmt->status[0].u32[iVar3];
    iVar1 = (uVar7 >> 0x1b ^ uVar7) * 0x19660d;
    dsfmt->status[0].u32[iVar3] = dsfmt->status[0].u32[iVar3] + iVar1;
    uVar8 = init_key[uVar6] + iVar4 + iVar1;
    dsfmt->status[0].u32[(iVar4 + 0x185) % 0x300] =
         dsfmt->status[0].u32[(iVar4 + 0x185) % 0x300] + uVar8;
    dsfmt->status[0].u32[iVar4] = uVar8;
    uVar5 = (long)(iVar4 + 1) % 0x300 & 0xffffffff;
  }
  uVar7 = 0x2ff;
  if (0x2ff < key_length) {
    uVar7 = key_length;
  }
  for (; (uint)uVar2 < uVar7; uVar2 = (ulong)((uint)uVar2 + 1)) {
    iVar1 = (int)uVar5;
    iVar4 = (iVar1 + 0x17a) % 0x300;
    uVar9 = dsfmt->status[0].u32[iVar1] ^ dsfmt->status[0].u32[(iVar1 + 0x2ff) % 0x300] ^
            dsfmt->status[0].u32[iVar4];
    iVar3 = (uVar9 >> 0x1b ^ uVar9) * 0x19660d;
    dsfmt->status[0].u32[iVar4] = dsfmt->status[0].u32[iVar4] + iVar3;
    uVar8 = iVar3 + iVar1;
    dsfmt->status[0].u32[(iVar1 + 0x185) % 0x300] =
         dsfmt->status[0].u32[(iVar1 + 0x185) % 0x300] + uVar8;
    dsfmt->status[0].u32[iVar1] = uVar8;
    uVar5 = (long)(iVar1 + 1) % 0x300 & 0xffffffff;
  }
  iVar1 = 0x300;
  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
    iVar4 = (int)uVar5;
    iVar3 = (iVar4 + 0x17a) % 0x300;
    uVar7 = dsfmt->status[0].u32[iVar4] + dsfmt->status[0].u32[iVar3] +
            dsfmt->status[0].u32[(iVar4 + 0x2ff) % 0x300];
    uVar7 = (uVar7 >> 0x1b ^ uVar7) * 0x5d588b65;
    dsfmt->status[0].u32[iVar3] = dsfmt->status[0].u32[iVar3] ^ uVar7;
    uVar7 = uVar7 - iVar4;
    dsfmt->status[0].u32[(iVar4 + 0x185) % 0x300] =
         dsfmt->status[0].u32[(iVar4 + 0x185) % 0x300] ^ uVar7;
    dsfmt->status[0].u32[iVar4] = uVar7;
    uVar5 = (long)(iVar4 + 1) % 0x300 & 0xffffffff;
  }
  initial_mask(dsfmt);
  period_certification(dsfmt);
  dsfmt->idx = 0x17e;
  return;
}

Assistant:

void dsfmt_chk_init_by_array(dsfmt_t* dsfmt, uint32_t init_key[],
                             int key_length, int mexp)
{
	int i, j, count;
	uint32_t r;
	uint32_t* psfmt32;
	int lag;
	int mid;
	int size = (DSFMT_N + 1) * 4; /* pulmonary */

	/* make sure caller program is compiled with the same MEXP */
	if (mexp != dsfmt_mexp)
	{
		fprintf(stderr, "DSFMT_MEXP doesn't match with dSFMT.c\n");
		exit(1);
	}
	if (size >= 623)
	{
		lag = 11;
	}
	else if (size >= 68)
	{
		lag = 7;
	}
	else if (size >= 39)
	{
		lag = 5;
	}
	else
	{
		lag = 3;
	}
	mid = (size - lag) / 2;

	psfmt32 = &dsfmt->status[0].u32[0];
	memset(dsfmt->status, 0x8b, sizeof(dsfmt->status));
	if (key_length + 1 > size)
	{
		count = key_length + 1;
	}
	else
	{
		count = size;
	}
	r = ini_func1(psfmt32[idxof(0)] ^ psfmt32[idxof(mid % size)]
		^ psfmt32[idxof((size - 1) % size)]);
	psfmt32[idxof(mid % size)] += r;
	r += key_length;
	psfmt32[idxof((mid + lag) % size)] += r;
	psfmt32[idxof(0)] = r;
	count--;
	for (i = 1, j = 0; (j < count) && (j < key_length); j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += init_key[j] + i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (; j < count; j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (j = 0; j < size; j++)
	{
		r = ini_func2(psfmt32[idxof(i)]
			+ psfmt32[idxof((i + mid) % size)]
			+ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] ^= r;
		r -= i;
		psfmt32[idxof((i + mid + lag) % size)] ^= r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	initial_mask(dsfmt);
	period_certification(dsfmt);
	dsfmt->idx = DSFMT_N64;
}